

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlParserErrors
xmlParseInNodeContext(xmlNodePtr node,char *data,int datalen,int options,xmlNodePtr *lst)

{
  xmlChar xVar1;
  xmlElementType xVar2;
  xmlParserCtxtPtr ctxt;
  _xmlDict *p_Var3;
  xmlChar *pxVar4;
  xmlCharEncodingHandlerPtr handler;
  xmlNodePtr cur;
  _xmlDoc *p_Var5;
  xmlChar *URL;
  xmlChar *pxVar6;
  _xmlNode *p_Var7;
  xmlNs *pxVar8;
  xmlParserErrors xVar9;
  int nr;
  _xmlDoc *p_Var10;
  
  if (datalen < 0) {
    return XML_ERR_INTERNAL_ERROR;
  }
  if (data == (char *)0x0) {
    return XML_ERR_INTERNAL_ERROR;
  }
  if (node == (xmlNodePtr)0x0) {
    return XML_ERR_INTERNAL_ERROR;
  }
  if (lst == (xmlNodePtr *)0x0) {
    return XML_ERR_INTERNAL_ERROR;
  }
  if (XML_HTML_DOCUMENT_NODE < node->type) {
    return XML_ERR_INTERNAL_ERROR;
  }
  if ((0x23beU >> (node->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
    return XML_ERR_INTERNAL_ERROR;
  }
  while (xVar2 = ((_xmlDoc *)node)->type, xVar2 != XML_ELEMENT_NODE) {
    p_Var10 = (_xmlDoc *)node;
    if ((xVar2 == XML_DOCUMENT_NODE) || (xVar2 == XML_HTML_DOCUMENT_NODE)) goto LAB_0016552f;
    node = ((_xmlDoc *)node)->parent;
    if ((_xmlDoc *)node == (_xmlDoc *)0x0) {
      return XML_ERR_INTERNAL_ERROR;
    }
  }
  p_Var10 = ((_xmlDoc *)node)->doc;
  if (p_Var10 == (_xmlDoc *)0x0) {
    return XML_ERR_INTERNAL_ERROR;
  }
  xVar2 = p_Var10->type;
LAB_0016552f:
  if (xVar2 == XML_HTML_DOCUMENT_NODE) {
    ctxt = htmlCreateMemoryParserCtxt(data,datalen);
    options = options | 0x2000;
  }
  else {
    if (xVar2 != XML_DOCUMENT_NODE) {
      return XML_ERR_INTERNAL_ERROR;
    }
    ctxt = xmlCreateMemoryParserCtxt(data,datalen);
  }
  xVar9 = XML_ERR_NO_MEMORY;
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return XML_ERR_NO_MEMORY;
  }
  p_Var3 = p_Var10->dict;
  if (p_Var3 == (_xmlDict *)0x0) {
    options = options | 0x1000;
  }
  else {
    if (ctxt->dict != (xmlDictPtr)0x0) {
      xmlDictFree(ctxt->dict);
      p_Var3 = p_Var10->dict;
    }
    ctxt->dict = p_Var3;
  }
  pxVar4 = p_Var10->encoding;
  if (pxVar4 != (xmlChar *)0x0) {
    if (ctxt->encoding != (xmlChar *)0x0) {
      (*xmlFree)(ctxt->encoding);
      pxVar4 = p_Var10->encoding;
    }
    pxVar4 = xmlStrdup(pxVar4);
    ctxt->encoding = pxVar4;
    handler = xmlFindCharEncodingHandler((char *)p_Var10->encoding);
    if (handler == (xmlCharEncodingHandlerPtr)0x0) {
      return XML_ERR_UNSUPPORTED_ENCODING;
    }
    xmlSwitchToEncoding(ctxt,handler);
  }
  nr = 0;
  xmlCtxtUseOptionsInternal(ctxt,options,(char *)0x0);
  xmlDetectSAX2(ctxt);
  ctxt->myDoc = p_Var10;
  ctxt->input_id = 2;
  ctxt->instate = XML_PARSER_CONTENT;
  cur = xmlNewDocComment(((_xmlDoc *)node)->doc,(xmlChar *)0x0);
  if (cur == (xmlNodePtr)0x0) goto LAB_00165833;
  xmlAddChild(node,cur);
  if (((_xmlDoc *)node)->type == XML_ELEMENT_NODE) {
    nodePush(ctxt,node);
    nr = 0;
    p_Var5 = (_xmlDoc *)node;
    do {
      if (((xmlNodePtr)p_Var5)->type != XML_ELEMENT_NODE) break;
      for (pxVar8 = ((xmlNodePtr)p_Var5)->nsDef; pxVar8 != (xmlNs *)0x0; pxVar8 = pxVar8->next) {
        pxVar4 = pxVar8->prefix;
        if (ctxt->dict == (xmlDictPtr)0x0) {
          URL = pxVar8->href;
        }
        else {
          pxVar4 = xmlDictLookup(ctxt->dict,pxVar4,-1);
          URL = xmlDictLookup(ctxt->dict,pxVar8->href,-1);
        }
        pxVar6 = xmlGetNamespace(ctxt,pxVar4);
        if (pxVar6 == (xmlChar *)0x0) {
          nsPush(ctxt,pxVar4,URL);
          nr = nr + 1;
        }
      }
      p_Var5 = (_xmlDoc *)((xmlNodePtr)p_Var5)->parent;
    } while (p_Var5 != (_xmlDoc *)0x0);
  }
  if ((ctxt->validate != 0) || (ctxt->replaceEntities != 0)) {
    *(byte *)&ctxt->loadsubset = (byte)ctxt->loadsubset | 8;
  }
  if (p_Var10->type == XML_HTML_DOCUMENT_NODE) {
    __htmlParseContent(ctxt);
  }
  else {
    xmlParseContent(ctxt);
  }
  nsPop(ctxt,nr);
  pxVar4 = ctxt->input->cur;
  xVar1 = *pxVar4;
  if (xVar1 != '\0') {
    if ((xVar1 != '<') || (xVar9 = XML_ERR_NOT_WELL_BALANCED, pxVar4[1] != '/')) {
      xVar9 = XML_ERR_EXTRA_CONTENT;
    }
    xmlFatalErr(ctxt,xVar9,(char *)0x0);
  }
  if (ctxt->node == node || ctxt->node == (xmlNodePtr)0x0) {
    xVar9 = XML_ERR_OK;
    if (ctxt->wellFormed == 0) goto LAB_001657b0;
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
    ctxt->wellFormed = 0;
LAB_001657b0:
    xVar9 = ctxt->errNo + (uint)(ctxt->errNo == 0);
  }
  p_Var7 = cur->next;
  cur->next = (_xmlNode *)0x0;
  ((_xmlDoc *)node)->last = cur;
  if (p_Var7 == (_xmlNode *)0x0) {
    *lst = (xmlNodePtr)0x0;
  }
  else {
    p_Var7->prev = (_xmlNode *)0x0;
    *lst = p_Var7;
    do {
      p_Var7->parent = (_xmlNode *)0x0;
      p_Var7 = p_Var7->next;
    } while (p_Var7 != (_xmlNode *)0x0);
  }
  xmlUnlinkNode(cur);
  xmlFreeNode(cur);
  if (xVar9 != XML_ERR_OK) {
    xmlFreeNodeList(*lst);
    *lst = (xmlNodePtr)0x0;
  }
  if (p_Var10->dict != (_xmlDict *)0x0) {
    ctxt->dict = (xmlDictPtr)0x0;
  }
LAB_00165833:
  xmlFreeParserCtxt(ctxt);
  return xVar9;
}

Assistant:

xmlParserErrors
xmlParseInNodeContext(xmlNodePtr node, const char *data, int datalen,
                      int options, xmlNodePtr *lst) {
#ifdef SAX2
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc = NULL;
    xmlNodePtr fake, cur;
    int nsnr = 0;

    xmlParserErrors ret = XML_ERR_OK;

    /*
     * check all input parameters, grab the document
     */
    if ((lst == NULL) || (node == NULL) || (data == NULL) || (datalen < 0))
        return(XML_ERR_INTERNAL_ERROR);
    switch (node->type) {
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    break;
	default:
	    return(XML_ERR_INTERNAL_ERROR);

    }
    while ((node != NULL) && (node->type != XML_ELEMENT_NODE) &&
           (node->type != XML_DOCUMENT_NODE) &&
	   (node->type != XML_HTML_DOCUMENT_NODE))
	node = node->parent;
    if (node == NULL)
	return(XML_ERR_INTERNAL_ERROR);
    if (node->type == XML_ELEMENT_NODE)
	doc = node->doc;
    else
        doc = (xmlDocPtr) node;
    if (doc == NULL)
	return(XML_ERR_INTERNAL_ERROR);

    /*
     * allocate a context and set-up everything not related to the
     * node position in the tree
     */
    if (doc->type == XML_DOCUMENT_NODE)
	ctxt = xmlCreateMemoryParserCtxt((char *) data, datalen);
#ifdef LIBXML_HTML_ENABLED
    else if (doc->type == XML_HTML_DOCUMENT_NODE) {
	ctxt = htmlCreateMemoryParserCtxt((char *) data, datalen);
        /*
         * When parsing in context, it makes no sense to add implied
         * elements like html/body/etc...
         */
        options |= HTML_PARSE_NOIMPLIED;
    }
#endif
    else
        return(XML_ERR_INTERNAL_ERROR);

    if (ctxt == NULL)
        return(XML_ERR_NO_MEMORY);

    /*
     * Use input doc's dict if present, else assure XML_PARSE_NODICT is set.
     * We need a dictionary for xmlDetectSAX2, so if there's no doc dict
     * we must wait until the last moment to free the original one.
     */
    if (doc->dict != NULL) {
        if (ctxt->dict != NULL)
	    xmlDictFree(ctxt->dict);
	ctxt->dict = doc->dict;
    } else
        options |= XML_PARSE_NODICT;

    if (doc->encoding != NULL) {
        xmlCharEncodingHandlerPtr hdlr;

        if (ctxt->encoding != NULL)
	    xmlFree((xmlChar *) ctxt->encoding);
        ctxt->encoding = xmlStrdup((const xmlChar *) doc->encoding);

        hdlr = xmlFindCharEncodingHandler((const char *) doc->encoding);
        if (hdlr != NULL) {
            xmlSwitchToEncoding(ctxt, hdlr);
	} else {
            return(XML_ERR_UNSUPPORTED_ENCODING);
        }
    }

    xmlCtxtUseOptionsInternal(ctxt, options, NULL);
    xmlDetectSAX2(ctxt);
    ctxt->myDoc = doc;
    /* parsing in context, i.e. as within existing content */
    ctxt->input_id = 2;
    ctxt->instate = XML_PARSER_CONTENT;

    fake = xmlNewDocComment(node->doc, NULL);
    if (fake == NULL) {
        xmlFreeParserCtxt(ctxt);
	return(XML_ERR_NO_MEMORY);
    }
    xmlAddChild(node, fake);

    if (node->type == XML_ELEMENT_NODE) {
	nodePush(ctxt, node);
	/*
	 * initialize the SAX2 namespaces stack
	 */
	cur = node;
	while ((cur != NULL) && (cur->type == XML_ELEMENT_NODE)) {
	    xmlNsPtr ns = cur->nsDef;
	    const xmlChar *iprefix, *ihref;

	    while (ns != NULL) {
		if (ctxt->dict) {
		    iprefix = xmlDictLookup(ctxt->dict, ns->prefix, -1);
		    ihref = xmlDictLookup(ctxt->dict, ns->href, -1);
		} else {
		    iprefix = ns->prefix;
		    ihref = ns->href;
		}

	        if (xmlGetNamespace(ctxt, iprefix) == NULL) {
		    nsPush(ctxt, iprefix, ihref);
		    nsnr++;
		}
		ns = ns->next;
	    }
	    cur = cur->parent;
	}
    }

    if ((ctxt->validate) || (ctxt->replaceEntities != 0)) {
	/*
	 * ID/IDREF registration will be done in xmlValidateElement below
	 */
	ctxt->loadsubset |= XML_SKIP_IDS;
    }

#ifdef LIBXML_HTML_ENABLED
    if (doc->type == XML_HTML_DOCUMENT_NODE)
        __htmlParseContent(ctxt);
    else
#endif
	xmlParseContent(ctxt);

    nsPop(ctxt, nsnr);
    if ((RAW == '<') && (NXT(1) == '/')) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
    } else if (RAW != 0) {
	xmlFatalErr(ctxt, XML_ERR_EXTRA_CONTENT, NULL);
    }
    if ((ctxt->node != NULL) && (ctxt->node != node)) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
	ctxt->wellFormed = 0;
    }

    if (!ctxt->wellFormed) {
        if (ctxt->errNo == 0)
	    ret = XML_ERR_INTERNAL_ERROR;
	else
	    ret = (xmlParserErrors)ctxt->errNo;
    } else {
        ret = XML_ERR_OK;
    }

    /*
     * Return the newly created nodeset after unlinking it from
     * the pseudo sibling.
     */

    cur = fake->next;
    fake->next = NULL;
    node->last = fake;

    if (cur != NULL) {
	cur->prev = NULL;
    }

    *lst = cur;

    while (cur != NULL) {
	cur->parent = NULL;
	cur = cur->next;
    }

    xmlUnlinkNode(fake);
    xmlFreeNode(fake);


    if (ret != XML_ERR_OK) {
        xmlFreeNodeList(*lst);
	*lst = NULL;
    }

    if (doc->dict != NULL)
        ctxt->dict = NULL;
    xmlFreeParserCtxt(ctxt);

    return(ret);
#else /* !SAX2 */
    return(XML_ERR_INTERNAL_ERROR);
#endif
}